

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int find_var_in_child_scope(JSContext *ctx,JSFunctionDef *fd,JSAtom name,int scope_level)

{
  BOOL BVar1;
  JSVarDef *pJVar2;
  int in_ECX;
  JSAtom in_EDX;
  JSFunctionDef *in_RSI;
  JSContext *in_RDI;
  JSVarDef *vd;
  int i;
  int local_24;
  
  local_24 = 0;
  while( true ) {
    if (in_RSI->var_count <= local_24) {
      return -1;
    }
    pJVar2 = in_RSI->vars + local_24;
    if (((pJVar2->var_name == in_EDX) && (pJVar2->scope_level == 0)) &&
       (BVar1 = is_child_scope(in_RDI,in_RSI,pJVar2->scope_next,in_ECX), BVar1 != 0)) break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

static int find_var_in_child_scope(JSContext *ctx, JSFunctionDef *fd,
                                   JSAtom name, int scope_level)
{
    int i;
    for(i = 0; i < fd->var_count; i++) {
        JSVarDef *vd = &fd->vars[i];
        if (vd->var_name == name && vd->scope_level == 0) {
            if (is_child_scope(ctx, fd, vd->scope_next,
                               scope_level))
                return i;
        }
    }
    return -1;
}